

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natives.c
# Opt level: O3

void ch_native_string_contains(ch_context *vm,ch_argcount argcount)

{
  _Bool _Var1;
  undefined1 uVar2;
  ch_primitive primitive;
  ch_string *haystack;
  ch_string *needle;
  ch_string *local_18;
  ch_string *local_10;
  
  _Var1 = ch_checkargcount(vm,'\x02',argcount);
  if (_Var1) {
    _Var1 = ch_popstring(vm,&local_10);
    if (_Var1) {
      _Var1 = ch_popstring(vm,&local_18);
      if (_Var1) {
        uVar2 = ch_containsstring(vm,local_18,local_10);
        primitive.field_1.boolean_value = (_Bool)uVar2;
        primitive._0_8_ = 1;
        primitive.field_1._1_7_ = 0;
        ch_push(vm,primitive);
      }
    }
  }
  return;
}

Assistant:

void ch_native_string_contains(ch_context* vm, ch_argcount argcount) {
	if (!ch_checkargcount(vm, 2, argcount)) return;

	ch_string* needle;
	if(!ch_popstring(vm, &needle)) return;

	ch_string* haystack;
	if(!ch_popstring(vm, &haystack)) return;

	bool contains = ch_containsstring(vm, haystack, needle);
	ch_push(vm, MAKE_BOOLEAN(contains));
}